

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSecureDelete(Btree *p,int newFlag)

{
  int b;
  int newFlag_local;
  Btree *p_local;
  
  if (p == (Btree *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    sqlite3BtreeEnter(p);
    if (-1 < newFlag) {
      p->pBt->btsFlags = p->pBt->btsFlags & 0xfff3;
      p->pBt->btsFlags = p->pBt->btsFlags | (ushort)(newFlag << 2);
    }
    p_local._4_4_ = (p->pBt->btsFlags & 0xc) / 4;
    sqlite3BtreeLeave(p);
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSecureDelete(Btree *p, int newFlag){
  int b;
  if( p==0 ) return 0;
  sqlite3BtreeEnter(p);
  assert( BTS_OVERWRITE==BTS_SECURE_DELETE*2 );
  assert( BTS_FAST_SECURE==(BTS_OVERWRITE|BTS_SECURE_DELETE) );
  if( newFlag>=0 ){
    p->pBt->btsFlags &= ~BTS_FAST_SECURE;
    p->pBt->btsFlags |= BTS_SECURE_DELETE*newFlag;
  }
  b = (p->pBt->btsFlags & BTS_FAST_SECURE)/BTS_SECURE_DELETE;
  sqlite3BtreeLeave(p);
  return b;
}